

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

void __thiscall
TPZSkylMatrix<std::complex<float>_>::Read
          (TPZSkylMatrix<std::complex<float>_> *this,TPZStream *buf,void *context)

{
  complex<float> *pcVar1;
  long lVar2;
  int64_t i;
  long lVar3;
  complex<float> *pcVar4;
  TPZVec<long> skyl;
  long local_40;
  TPZVec<long> local_38;
  
  TPZBaseMatrix::Read((TPZBaseMatrix *)this,buf,context);
  TPZStream::Read<std::complex<float>>(buf,&this->fStorage);
  local_40 = 0;
  TPZVec<long>::TPZVec
            (&local_38,(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow + 1,
             &local_40);
  TPZStream::Read<long>(buf,&local_38);
  pcVar1 = (complex<float> *)(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
  pcVar4 = pcVar1;
  if (pcVar1 != (complex<float> *)0x0) {
    pcVar4 = (this->fStorage).fStore;
  }
  TPZVec<std::complex<float>_*>::Resize(&this->fElem,(int64_t)((long)&pcVar1->_M_value + 1));
  lVar2 = (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
  for (lVar3 = 0; lVar3 <= lVar2; lVar3 = lVar3 + 1) {
    (this->fElem).fStore[lVar3] = pcVar4 + local_38.fStore[lVar3];
  }
  TPZVec<long>::~TPZVec(&local_38);
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::Read(TPZStream &buf, void *context )
{
    TPZMatrix<TVar>::Read(buf, context);
    buf.Read( fStorage);
    TPZVec<int64_t> skyl(this->Rows()+1,0);
    buf.Read( skyl);
    TVar *ptr = 0;
    if (this->Rows()) {
        ptr = &fStorage[0];
    }
    fElem.Resize(this->Rows()+1);
    for (int64_t i=0; i<this->Rows()+1; i++) {
        fElem[i] = skyl[i] + ptr;
    }
}